

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketCompression.cpp
# Opt level: O0

Result __thiscall
tonk::MessageDecompressor::Initialize(MessageDecompressor *this,uint maxCompressedMessagesBytes)

{
  uint uVar1;
  ZSTD_DCtx *pZVar2;
  char *pcVar3;
  string *desc;
  undefined4 in_EDX;
  long in_RSI;
  ErrorResult *in_RDI;
  size_t beginResult;
  ErrorCodeT in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  ErrorType type;
  ErrorResult *pEVar4;
  string *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  allocator *source;
  ErrorResult *in_stack_fffffffffffffed0;
  allocator local_e9;
  string local_e8 [32];
  size_t local_c8;
  allocator local_a9;
  string local_a8 [72];
  undefined8 local_60;
  undefined4 local_54;
  string *local_50;
  char *local_48;
  size_t local_28;
  undefined4 local_1c;
  string *local_18;
  char *local_10;
  
  type = (ErrorType)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  *(undefined4 *)(in_RSI + 0x5dd0) = in_EDX;
  pZVar2 = ZSTD_createDCtx();
  *(ZSTD_DCtx **)(in_RSI + 0x5dc8) = pZVar2;
  if (*(long *)(in_RSI + 0x5dc8) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"ZSTD_createDCtx failed",&local_a9);
    local_48 = "SessionIncoming::Initialize";
    local_50 = local_a8;
    local_54 = 6;
    local_60 = 2;
    pcVar3 = (char *)operator_new(0x38);
    ErrorResult::ErrorResult
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,type,
               in_stack_fffffffffffffeb0);
    in_RDI->Source = pcVar3;
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  else {
    local_c8 = ZSTD_decompressBegin((ZSTD_DCtx *)0x1d0732);
    uVar1 = ZSTD_isError(0x1d0747);
    if (uVar1 == 0) {
      Result::Success();
    }
    else {
      source = &local_e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e8,"ZSTD_decompressBegin failed",source);
      local_10 = "SessionIncoming::Initialize";
      local_18 = local_e8;
      local_1c = 6;
      local_28 = local_c8;
      pEVar4 = in_RDI;
      desc = (string *)operator_new(0x38);
      ErrorResult::ErrorResult
                (in_stack_fffffffffffffed0,(char *)source,desc,(ErrorType)((ulong)pEVar4 >> 0x20),
                 in_stack_fffffffffffffeb0);
      pEVar4->Source = (char *)desc;
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    }
  }
  return (Result)in_RDI;
}

Assistant:

Result MessageDecompressor::Initialize(unsigned maxCompressedMessagesBytes)
{
    MaxCompressedMessagesBytes = maxCompressedMessagesBytes;
    DCtx = ZSTD_createDCtx();

    if (!DCtx) {
        return Result("SessionIncoming::Initialize", "ZSTD_createDCtx failed", ErrorType::Zstd);
    }

    const size_t beginResult = ZSTD_decompressBegin(DCtx);

    if (0 != ZSTD_isError(beginResult)) {
        return Result("SessionIncoming::Initialize", "ZSTD_decompressBegin failed", ErrorType::Zstd, beginResult);
    }

    return Result::Success();
}